

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imstb_truetype.h
# Opt level: O0

void stbtt__handle_clipped_edge
               (float *scanline,int x,stbtt__active_edge *e,float x0,float y0,float x1,float y1)

{
  float y1_local;
  float x1_local;
  float y0_local;
  float x0_local;
  stbtt__active_edge *e_local;
  int x_local;
  float *scanline_local;
  
  if ((((y0 != y1) || (NAN(y0) || NAN(y1))) && (y0 < e->ey || y0 == e->ey)) && (e->sy <= y1)) {
    y0_local = y0;
    x0_local = x0;
    if (y0 < e->sy) {
      x0_local = ((x1 - x0) * (e->sy - y0)) / (y1 - y0) + x0;
      y0_local = e->sy;
    }
    y1_local = y1;
    x1_local = x1;
    if (e->ey <= y1 && y1 != e->ey) {
      x1_local = ((x1 - x0_local) * (e->ey - y1)) / (y1 - y0_local) + x1;
      y1_local = e->ey;
    }
    if (((float)x < x0_local) || ((float)x < x1_local)) {
      if ((x0_local < (float)(x + 1)) || (x1_local < (float)(x + 1))) {
        scanline[x] = e->direction * (y1_local - y0_local) *
                      (1.0 - ((x0_local - (float)x) + (x1_local - (float)x)) / 2.0) + scanline[x];
      }
    }
    else {
      scanline[x] = e->direction * (y1_local - y0_local) + scanline[x];
    }
  }
  return;
}

Assistant:

static void stbtt__handle_clipped_edge(float *scanline, int x, stbtt__active_edge *e, float x0, float y0, float x1, float y1)
{
   if (y0 == y1) return;
   STBTT_assert(y0 < y1);
   STBTT_assert(e->sy <= e->ey);
   if (y0 > e->ey) return;
   if (y1 < e->sy) return;
   if (y0 < e->sy) {
      x0 += (x1-x0) * (e->sy - y0) / (y1-y0);
      y0 = e->sy;
   }
   if (y1 > e->ey) {
      x1 += (x1-x0) * (e->ey - y1) / (y1-y0);
      y1 = e->ey;
   }

   if (x0 == x)
      STBTT_assert(x1 <= x+1);
   else if (x0 == x+1)
      STBTT_assert(x1 >= x);
   else if (x0 <= x)
      STBTT_assert(x1 <= x);
   else if (x0 >= x+1)
      STBTT_assert(x1 >= x+1);
   else
      STBTT_assert(x1 >= x && x1 <= x+1);

   if (x0 <= x && x1 <= x)
      scanline[x] += e->direction * (y1-y0);
   else if (x0 >= x+1 && x1 >= x+1)
      ;
   else {
      STBTT_assert(x0 >= x && x0 <= x+1 && x1 >= x && x1 <= x+1);
      scanline[x] += e->direction * (y1-y0) * (1-((x0-x)+(x1-x))/2); // coverage = 1 - average x position
   }
}